

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::OneHotEncoder::_InternalParse
          (OneHotEncoder *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  StringVector *msg;
  uint64_t uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint uVar3;
  char cVar4;
  uint32_t tag;
  char *local_40;
  uint local_34;
  
  local_40 = ptr;
  do {
    while( true ) {
      while( true ) {
        bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_40);
        if (bVar1) {
          return local_40;
        }
        local_40 = google::protobuf::internal::ReadTag(local_40,&local_34,0);
        tag_00 = local_34;
        uVar3 = local_34 >> 3;
        cVar4 = (char)local_34;
        if (uVar3 != 0xb) break;
        if (cVar4 != 'X') goto LAB_00243612;
        uVar2 = google::protobuf::internal::ReadVarint64(&local_40);
        if (local_40 == (char *)0x0) {
          return (char *)0x0;
        }
        this->handleunknown_ = (int)uVar2;
      }
      if (uVar3 != 2) break;
      if (cVar4 != '\x12') goto LAB_00243612;
      msg = (StringVector *)_internal_mutable_int64categories(this);
LAB_002435bd:
      local_40 = google::protobuf::internal::ParseContext::ParseMessage
                           (ctx,&msg->super_MessageLite,local_40);
LAB_0024363a:
      if (local_40 == (char *)0x0) {
        return (char *)0x0;
      }
    }
    if (uVar3 != 10) {
      if ((uVar3 == 1) && (cVar4 == '\n')) {
        msg = _internal_mutable_stringcategories(this);
        goto LAB_002435bd;
      }
LAB_00243612:
      if ((local_34 == 0) || ((local_34 & 7) == 4)) {
        if (local_40 == (char *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_34 - 1;
        return local_40;
      }
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields<std::__cxx11::string>
                          (&(this->super_MessageLite)._internal_metadata_);
      local_40 = google::protobuf::internal::UnknownFieldParse(tag_00,unknown,local_40,ctx);
      goto LAB_0024363a;
    }
    if (cVar4 != 'P') goto LAB_00243612;
    uVar2 = google::protobuf::internal::ReadVarint64(&local_40);
    this->outputsparse_ = uVar2 != 0;
    if (local_40 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* OneHotEncoder::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // .CoreML.Specification.StringVector stringCategories = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ctx->ParseMessage(_internal_mutable_stringcategories(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64Vector int64Categories = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr = ctx->ParseMessage(_internal_mutable_int64categories(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bool outputSparse = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 80)) {
          outputsparse_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.OneHotEncoder.HandleUnknown handleUnknown = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 88)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_handleunknown(static_cast<::CoreML::Specification::OneHotEncoder_HandleUnknown>(val));
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}